

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 gen_lea_indexed(CPUM68KState_conflict *env,DisasContext_conflict2 *s,TCGv_i32 base)

{
  target_ulong_conflict tVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  char cVar2;
  uint16_t uVar3;
  int iVar4;
  TCGv_i32 pTVar5;
  TCGv_i32 pTVar6;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t od;
  uint32_t bd;
  TCGv_i32 tmp;
  TCGv_i32 add;
  uint16_t ext;
  uint32_t offset;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 base_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tVar1 = s->pc;
  add._2_2_ = read_im16(env,s);
  if (((add._2_2_ & 0x800) == 0) && (iVar4 = m68k_feature(s->env,0xf), iVar4 == 0)) {
    env_local = (CPUM68KState_conflict *)tcg_ctx_00->NULL_QREG;
  }
  else {
    iVar4 = m68k_feature(s->env,0);
    if ((iVar4 != 0) && (iVar4 = m68k_feature(s->env,0x10), iVar4 == 0)) {
      add._2_2_ = add._2_2_ & 63999;
    }
    if ((add._2_2_ & 0x100) == 0) {
      pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
      tmp = mark_to_release(s,pTVar5);
      pTVar5 = gen_addr_index(s,add._2_2_,tmp);
      cVar2 = (char)add._2_2_;
      if (base == tcg_ctx_00->NULL_QREG) {
        tcg_gen_addi_i32_m68k(tcg_ctx_00,tmp,pTVar5,tVar1 + (int)cVar2);
      }
      else {
        tcg_gen_add_i32(tcg_ctx_00,tmp,pTVar5,base);
        if (cVar2 != '\0') {
          tcg_gen_addi_i32_m68k(tcg_ctx_00,tmp,tmp,(int)cVar2);
        }
      }
    }
    else {
      iVar4 = m68k_feature(s->env,0xe);
      if (iVar4 == 0) {
        return tcg_ctx_00->NULL_QREG;
      }
      if ((add._2_2_ & 0x30) < 0x11) {
        local_4c = 0;
      }
      else if ((add._2_2_ & 0x30) == 0x20) {
        uVar3 = read_im16(env,s);
        local_4c = (uint32_t)(short)uVar3;
      }
      else {
        local_4c = read_im32(env,s);
      }
      pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar5 = mark_to_release(s,pTVar5);
      if ((add._2_2_ & 0x44) == 0) {
        tmp = gen_addr_index(s,add._2_2_,pTVar5);
      }
      else {
        tmp = tcg_ctx_00->NULL_QREG;
      }
      if ((add._2_2_ & 0x80) == 0) {
        tcg_ctx = (TCGContext_conflict2 *)base;
        if (base == tcg_ctx_00->NULL_QREG) {
          pTVar6 = tcg_const_i32_m68k(tcg_ctx_00,tVar1 + local_4c);
          tcg_ctx = (TCGContext_conflict2 *)mark_to_release(s,pTVar6);
          local_4c = 0;
        }
        if (tmp == tcg_ctx_00->NULL_QREG) {
          tmp = (TCGv_i32)tcg_ctx;
        }
        else {
          tcg_gen_add_i32(tcg_ctx_00,pTVar5,tmp,(TCGv_i32)tcg_ctx);
          tmp = pTVar5;
        }
      }
      if (tmp == tcg_ctx_00->NULL_QREG) {
        pTVar6 = tcg_const_i32_m68k(tcg_ctx_00,local_4c);
        tmp = mark_to_release(s,pTVar6);
      }
      else if (local_4c != 0) {
        tcg_gen_addi_i32_m68k(tcg_ctx_00,pTVar5,tmp,local_4c);
        tmp = pTVar5;
      }
      if ((add._2_2_ & 3) != 0) {
        pTVar6 = gen_load(s,2,tmp,0,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
        tmp = mark_to_release(s,pTVar6);
        if ((add._2_2_ & 0x44) == 4) {
          pTVar6 = gen_addr_index(s,add._2_2_,pTVar5);
          tcg_gen_add_i32(tcg_ctx_00,pTVar5,pTVar6,tmp);
          tmp = pTVar5;
        }
        if ((add._2_2_ & 3) < 2) {
          local_50 = 0;
        }
        else if ((add._2_2_ & 3) == 2) {
          uVar3 = read_im16(env,s);
          local_50 = (uint32_t)(short)uVar3;
        }
        else {
          local_50 = read_im32(env,s);
        }
        if (local_50 != 0) {
          tcg_gen_addi_i32_m68k(tcg_ctx_00,pTVar5,tmp,local_50);
          tmp = pTVar5;
        }
      }
    }
    env_local = (CPUM68KState_conflict *)tmp;
  }
  return (TCGv_i32)env_local;
}

Assistant:

static TCGv gen_lea_indexed(CPUM68KState *env, DisasContext *s, TCGv base)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t offset;
    uint16_t ext;
    TCGv add;
    TCGv tmp;
    uint32_t bd, od;

    offset = s->pc;
    ext = read_im16(env, s);

    if ((ext & 0x800) == 0 && !m68k_feature(s->env, M68K_FEATURE_WORD_INDEX))
        return tcg_ctx->NULL_QREG;

    if (m68k_feature(s->env, M68K_FEATURE_M68000) &&
        !m68k_feature(s->env, M68K_FEATURE_SCALED_INDEX)) {
        ext &= ~(3 << 9);
    }

    if (ext & 0x100) {
        /* full extension word format */
        if (!m68k_feature(s->env, M68K_FEATURE_EXT_FULL))
            return tcg_ctx->NULL_QREG;

        if ((ext & 0x30) > 0x10) {
            /* base displacement */
            if ((ext & 0x30) == 0x20) {
                bd = (int16_t)read_im16(env, s);
            } else {
                bd = read_im32(env, s);
            }
        } else {
            bd = 0;
        }
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        if ((ext & 0x44) == 0) {
            /* pre-index */
            add = gen_addr_index(s, ext, tmp);
        } else {
            add = tcg_ctx->NULL_QREG;
        }
        if ((ext & 0x80) == 0) {
            /* base not suppressed */
            if (IS_NULL_QREG(base)) {
                base = mark_to_release(s, tcg_const_i32(tcg_ctx, offset + bd));
                bd = 0;
            }
            if (!IS_NULL_QREG(add)) {
                tcg_gen_add_i32(tcg_ctx, tmp, add, base);
                add = tmp;
            } else {
                add = base;
            }
        }
        if (!IS_NULL_QREG(add)) {
            if (bd != 0) {
                tcg_gen_addi_i32(tcg_ctx, tmp, add, bd);
                add = tmp;
            }
        } else {
            add = mark_to_release(s, tcg_const_i32(tcg_ctx, bd));
        }
        if ((ext & 3) != 0) {
            /* memory indirect */
            base = mark_to_release(s, gen_load(s, OS_LONG, add, 0, IS_USER(s)));
            if ((ext & 0x44) == 4) {
                add = gen_addr_index(s, ext, tmp);
                tcg_gen_add_i32(tcg_ctx, tmp, add, base);
                add = tmp;
            } else {
                add = base;
            }
            if ((ext & 3) > 1) {
                /* outer displacement */
                if ((ext & 3) == 2) {
                    od = (int16_t)read_im16(env, s);
                } else {
                    od = read_im32(env, s);
                }
            } else {
                od = 0;
            }
            if (od != 0) {
                tcg_gen_addi_i32(tcg_ctx, tmp, add, od);
                add = tmp;
            }
        }
    } else {
        /* brief extension word format */
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        add = gen_addr_index(s, ext, tmp);
        if (!IS_NULL_QREG(base)) {
            tcg_gen_add_i32(tcg_ctx, tmp, add, base);
            if ((int8_t)ext)
                tcg_gen_addi_i32(tcg_ctx, tmp, tmp, (int8_t)ext);
        } else {
            tcg_gen_addi_i32(tcg_ctx, tmp, add, offset + (int8_t)ext);
        }
        add = tmp;
    }
    return add;
}